

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

void __thiscall RefTable::Mark(RefTable *this,SQCollectable_conflict **chain)

{
  ulong uVar1;
  RefNode *o;
  
  if (this->_numofslots != 0) {
    o = this->_nodes;
    uVar1 = 0;
    do {
      if ((o->obj).super_SQObject._type != OT_NULL) {
        SQSharedState::MarkObject(&o->obj,chain);
      }
      o = o + 1;
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->_numofslots);
  }
  return;
}

Assistant:

void RefTable::Mark(SQCollectable **chain)
{
    RefNode *nodes = (RefNode *)_nodes;
    for(SQUnsignedInteger n = 0; n < _numofslots; n++) {
        if(type(nodes->obj) != OT_NULL) {
            SQSharedState::MarkObject(nodes->obj,chain);
        }
        nodes++;
    }
}